

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O1

void __thiscall
GlobOpt::ArrayUpperBoundCheckHoistInfo::SetLoop
          (ArrayUpperBoundCheckHoistInfo *this,Loop *loop,int indexConstantValue,
          Value *headSegmentLengthValue,IntConstantBounds *headSegmentLengthConstantBounds,
          bool isLoopCountBasedBound)

{
  code *pcVar1;
  bool bVar2;
  BasicBlock *pBVar3;
  undefined4 *puVar4;
  
  pBVar3 = ArrayLowerBoundCheckHoistInfo::CompatibleBoundCheckBlock
                     (&this->super_ArrayLowerBoundCheckHoistInfo);
  if (pBVar3 != (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x86,"(!CompatibleBoundCheckBlock())","!CompatibleBoundCheckBlock()");
    if (!bVar2) goto LAB_004a8240;
    *puVar4 = 0;
  }
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x87,"(loop)","loop");
    if (!bVar2) goto LAB_004a8240;
    *puVar4 = 0;
  }
  if (headSegmentLengthValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x88,"(headSegmentLengthValue)","headSegmentLengthValue");
    if (!bVar2) {
LAB_004a8240:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  ArrayLowerBoundCheckHoistInfo::SetLoop
            (&this->super_ArrayLowerBoundCheckHoistInfo,loop,indexConstantValue,
             isLoopCountBasedBound);
  (this->super_ArrayLowerBoundCheckHoistInfo).offset = -1;
  this->headSegmentLengthValue = headSegmentLengthValue;
  this->headSegmentLengthConstantBounds = *headSegmentLengthConstantBounds;
  return;
}

Assistant:

void GlobOpt::ArrayUpperBoundCheckHoistInfo::SetLoop(
    ::Loop *const loop,
    const int indexConstantValue,
    Value *const headSegmentLengthValue,
    const IntConstantBounds &headSegmentLengthConstantBounds,
    const bool isLoopCountBasedBound)
{
    Assert(!CompatibleBoundCheckBlock());
    Assert(loop);
    Assert(headSegmentLengthValue);

    SetLoop(loop, indexConstantValue, isLoopCountBasedBound);
    offset = -1; // simulate < instead of <=
    this->headSegmentLengthValue = headSegmentLengthValue;
    this->headSegmentLengthConstantBounds = headSegmentLengthConstantBounds;
}